

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O0

void Omega_h::add_accept_production(Grammar *g)

{
  initializer_list<int> __l;
  allocator local_81;
  string local_80 [52];
  int local_4c;
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  Production p;
  int goal_symbol;
  Grammar *g_local;
  
  p.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = find_goal_symbol(g);
  Grammar::Production::Production((Production *)local_38);
  local_38._0_4_ = g->nsymbols;
  local_4c = p.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
  local_48 = &local_4c;
  local_40 = 1;
  __l._M_len = 1;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::operator=((vector<int,_std::allocator<int>_> *)&p,__l);
  std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
  push_back(&g->productions,(value_type *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"ACCEPT",&local_81);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&g->symbol_names,(value_type *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  g->nsymbols = g->nsymbols + 1;
  Grammar::Production::~Production((Production *)local_38);
  return;
}

Assistant:

void add_accept_production(Grammar& g) {
  auto goal_symbol = find_goal_symbol(g);
  Grammar::Production p;
  p.lhs = g.nsymbols;
  p.rhs = {goal_symbol};
  g.productions.push_back(p);
  g.symbol_names.push_back("ACCEPT");
  g.nsymbols++;
}